

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O0

void __thiscall
HawkTracer::client::TracepointMap::add_map_entry(TracepointMap *this,uint64_t id,string *label)

{
  mapped_type *this_00;
  undefined1 local_60 [8];
  MapInfo info;
  string *label_local;
  uint64_t id_local;
  TracepointMap *this_local;
  
  info._56_8_ = label;
  label_local = (string *)id;
  id_local = (uint64_t)this;
  std::__cxx11::string::string((string *)local_60,(string *)label);
  category_to_string_abi_cxx11_((TracepointMap *)&info.field_0x18,Unknown);
  this_00 = std::
            unordered_map<unsigned_long,_HawkTracer::client::TracepointMap::MapInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>_>
            ::operator[](&this->_input_map,(key_type *)&label_local);
  MapInfo::operator=(this_00,(MapInfo *)local_60);
  MapInfo::~MapInfo((MapInfo *)local_60);
  return;
}

Assistant:

void TracepointMap::add_map_entry(uint64_t id, std::string label)
{
    MapInfo info = { label, category_to_string(Unknown) };
    _input_map[id] = info;
}